

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O2

void pospopcnt_u8_avx2_horizreduce(uint8_t *data,size_t len,uint32_t *flag_counts)

{
  undefined1 (*pauVar1) [32];
  undefined1 (*pauVar2) [32];
  ulong uVar3;
  uint8_t *data_00;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [32];
  undefined1 auVar23 [64];
  undefined1 auVar24 [32];
  undefined1 auVar25 [64];
  undefined1 auVar26 [32];
  undefined1 auVar27 [64];
  undefined1 auVar28 [32];
  undefined1 auVar29 [64];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  
  auVar17._8_4_ = 0x55555555;
  auVar17._0_8_ = 0x5555555555555555;
  auVar17._12_4_ = 0x55555555;
  auVar17._16_4_ = 0x55555555;
  auVar17._20_4_ = 0x55555555;
  auVar17._24_4_ = 0x55555555;
  auVar17._28_4_ = 0x55555555;
  auVar30._8_4_ = 0x33333333;
  auVar30._0_8_ = 0x3333333333333333;
  auVar30._12_4_ = 0x33333333;
  auVar30._16_4_ = 0x33333333;
  auVar30._20_4_ = 0x33333333;
  auVar30._24_4_ = 0x33333333;
  auVar30._28_4_ = 0x33333333;
  auVar12[8] = 7;
  auVar12._0_8_ = 0x707070707070707;
  auVar12[9] = 7;
  auVar12[10] = 7;
  auVar12[0xb] = 7;
  auVar12[0xc] = 7;
  auVar12[0xd] = 7;
  auVar12[0xe] = 7;
  auVar12[0xf] = 7;
  auVar12[0x10] = 7;
  auVar12[0x11] = 7;
  auVar12[0x12] = 7;
  auVar12[0x13] = 7;
  auVar12[0x14] = 7;
  auVar12[0x15] = 7;
  auVar12[0x16] = 7;
  auVar12[0x17] = 7;
  auVar12[0x18] = 7;
  auVar12[0x19] = 7;
  auVar12[0x1a] = 7;
  auVar12[0x1b] = 7;
  auVar12[0x1c] = 7;
  auVar12[0x1d] = 7;
  auVar12[0x1e] = 7;
  auVar12[0x1f] = 7;
  auVar13[8] = 0x70;
  auVar13._0_8_ = 0x7070707070707070;
  auVar13[9] = 0x70;
  auVar13[10] = 0x70;
  auVar13[0xb] = 0x70;
  auVar13[0xc] = 0x70;
  auVar13[0xd] = 0x70;
  auVar13[0xe] = 0x70;
  auVar13[0xf] = 0x70;
  auVar13[0x10] = 0x70;
  auVar13[0x11] = 0x70;
  auVar13[0x12] = 0x70;
  auVar13[0x13] = 0x70;
  auVar13[0x14] = 0x70;
  auVar13[0x15] = 0x70;
  auVar13[0x16] = 0x70;
  auVar13[0x17] = 0x70;
  auVar13[0x18] = 0x70;
  auVar13[0x19] = 0x70;
  auVar13[0x1a] = 0x70;
  auVar13[0x1b] = 0x70;
  auVar13[0x1c] = 0x70;
  auVar13[0x1d] = 0x70;
  auVar13[0x1e] = 0x70;
  auVar13[0x1f] = 0x70;
  uVar3 = len & 0xffffffffffffff80;
  auVar18 = ZEXT1664((undefined1  [16])0x0);
  auVar23 = ZEXT1664((undefined1  [16])0x0);
  auVar19 = ZEXT1664((undefined1  [16])0x0);
  auVar25 = ZEXT1664((undefined1  [16])0x0);
  auVar20 = ZEXT1664((undefined1  [16])0x0);
  auVar27 = ZEXT1664((undefined1  [16])0x0);
  auVar21 = ZEXT1664((undefined1  [16])0x0);
  auVar29 = ZEXT1664((undefined1  [16])0x0);
  data_00 = data + uVar3;
  while( true ) {
    auVar22 = auVar25._0_32_;
    auVar11 = auVar19._0_32_;
    auVar24 = auVar27._0_32_;
    auVar28 = auVar29._0_32_;
    auVar26 = auVar23._0_32_;
    auVar16 = auVar18._0_32_;
    auVar10 = auVar20._0_32_;
    auVar9 = auVar21._0_32_;
    if (uVar3 == 0) break;
    auVar31 = *(undefined1 (*) [32])data;
    pauVar1 = (undefined1 (*) [32])((long)data + 0x20);
    pauVar2 = (undefined1 (*) [32])((long)data + 0x40);
    auVar5 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)data + 0x60));
    data = (uint8_t *)((long)data + 0x80);
    uVar3 = uVar3 - 0x80;
    auVar6 = vpandd_avx512vl(auVar31,auVar17);
    auVar7 = vpandd_avx512vl(*pauVar1,auVar17);
    auVar31 = vpsrld_avx2(auVar31,1);
    auVar32 = vpsrld_avx2(*pauVar1,1);
    auVar31 = vpand_avx2(auVar31,auVar17);
    auVar32 = vpand_avx2(auVar32,auVar17);
    auVar6 = vpaddd_avx512vl(auVar7,auVar6);
    auVar7 = vpandd_avx512vl(auVar5,auVar17);
    auVar5 = vpsrld_avx512vl(auVar5,1);
    auVar31 = vpaddd_avx2(auVar32,auVar31);
    auVar32 = vpand_avx2(*pauVar2,auVar17);
    auVar34 = vpsrld_avx2(*pauVar2,1);
    auVar5 = vpandd_avx512vl(auVar5,auVar17);
    auVar7 = vpaddd_avx512vl(auVar7,auVar32);
    auVar32 = vpand_avx2(auVar34,auVar17);
    auVar32 = vpaddd_avx512vl(auVar5,auVar32);
    auVar5 = vpandd_avx512vl(auVar6,auVar30);
    auVar34 = vpandd_avx512vl(auVar7,auVar30);
    auVar6 = vpsrld_avx512vl(auVar6,2);
    auVar33 = vpsrld_avx2(auVar7,2);
    auVar7 = vpaddd_avx512vl(auVar34,auVar5);
    auVar34 = vpandd_avx512vl(auVar31,auVar30);
    auVar8 = vpandd_avx512vl(auVar32,auVar30);
    auVar5 = vpsrld_avx2(auVar31,2);
    auVar35 = vpsrld_avx2(auVar32,2);
    auVar6 = vpandd_avx512vl(auVar6,auVar30);
    auVar31 = vpand_avx2(auVar33,auVar30);
    auVar32 = vpand_avx2(auVar5,auVar30);
    auVar5 = vpand_avx2(auVar35,auVar30);
    auVar34 = vpaddd_avx512vl(auVar8,auVar34);
    auVar6 = vpaddd_avx512vl(auVar31,auVar6);
    auVar31 = vpaddd_avx2(auVar5,auVar32);
    auVar5 = vpandq_avx512vl(auVar7,auVar12);
    auVar8 = vpandq_avx512vl(auVar34,auVar12);
    auVar33 = vpandq_avx512vl(auVar6,auVar12);
    auVar7 = vpandq_avx512vl(auVar7,auVar13);
    auVar34 = vpandq_avx512vl(auVar34,auVar13);
    auVar32 = vpand_avx2(auVar6,auVar13);
    auVar6 = vpandq_avx512vl(auVar31,auVar12);
    auVar31 = vpand_avx2(auVar31,auVar13);
    auVar35 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar5 = vpsadbw_avx2(auVar5,auVar35);
    auVar7 = vpsadbw_avx512vl(auVar7,auVar35);
    auVar8 = vpsadbw_avx512vl(auVar8,auVar35);
    auVar34 = vpsadbw_avx512vl(auVar34,auVar35);
    auVar33 = vpsadbw_avx512vl(auVar33,auVar35);
    auVar32 = vpsadbw_avx2(auVar32,auVar35);
    auVar6 = vpsadbw_avx512vl(auVar6,auVar35);
    auVar31 = vpsadbw_avx2(auVar31,auVar35);
    auVar28 = vpaddq_avx2(auVar5,auVar28);
    auVar29 = ZEXT3264(auVar28);
    auVar9 = vpaddq_avx512vl(auVar7,auVar9);
    auVar21 = ZEXT3264(auVar9);
    auVar9 = vpaddq_avx512vl(auVar8,auVar24);
    auVar27 = ZEXT3264(auVar9);
    auVar10 = vpaddq_avx512vl(auVar34,auVar10);
    auVar20 = ZEXT3264(auVar10);
    auVar10 = vpaddq_avx512vl(auVar33,auVar22);
    auVar25 = ZEXT3264(auVar10);
    auVar11 = vpaddq_avx2(auVar32,auVar11);
    auVar19 = ZEXT3264(auVar11);
    auVar11 = vpaddq_avx512vl(auVar6,auVar26);
    auVar23 = ZEXT3264(auVar11);
    auVar16 = vpaddq_avx2(auVar31,auVar16);
    auVar18 = ZEXT3264(auVar16);
  }
  auVar4 = vpunpcklqdq_avx(auVar29._0_16_,auVar27._0_16_);
  uVar14 = auVar23._0_8_;
  auVar32._8_8_ = uVar14;
  auVar32._0_8_ = uVar14;
  auVar32._16_8_ = uVar14;
  auVar32._24_8_ = uVar14;
  auVar30 = vpermq_avx2(auVar22,0x55);
  auVar31._0_16_ = ZEXT116(0) * auVar25._0_16_ + ZEXT116(1) * auVar4;
  auVar31._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar25._0_16_;
  auVar17 = vpblendd_avx2(auVar31,auVar32,0xc0);
  auVar4 = vpunpckhqdq_avx(auVar29._0_16_,auVar27._0_16_);
  auVar30 = vpblendd_avx2(ZEXT1632(auVar4),auVar30,0xf0);
  auVar15 = auVar18._0_16_;
  auVar5._0_16_ = ZEXT116(0) * auVar23._0_16_ + ZEXT116(1) * auVar15;
  auVar5._16_16_ = ZEXT116(0) * auVar18._16_16_ + ZEXT116(1) * auVar23._0_16_;
  auVar12 = vpblendd_avx2(auVar30,auVar5,0xc0);
  auVar30 = vpmovsxbq_avx2(ZEXT416(0x6020100));
  auVar17 = vpaddq_avx2(auVar17,auVar12);
  auVar12 = vpunpcklqdq_avx2(auVar28,auVar24);
  auVar13 = vpunpckhqdq_avx2(auVar28,auVar24);
  auVar12 = vperm2i128_avx2(auVar12,auVar22,0x31);
  auVar12 = vpermt2q_avx512vl(auVar12,auVar30,auVar26);
  auVar17 = vpaddq_avx2(auVar17,auVar12);
  auVar12 = vpmovsxbq_avx2(ZEXT416(0x7070302));
  auVar13 = vpermt2q_avx512vl(auVar13,auVar12,auVar22);
  uVar14 = auVar18._0_8_;
  auVar24._8_8_ = uVar14;
  auVar24._0_8_ = uVar14;
  auVar24._16_8_ = uVar14;
  auVar24._24_8_ = uVar14;
  auVar13 = vpblendd_avx2(auVar13,auVar26,0xc0);
  auVar26 = vpermq_avx2(auVar11,0x55);
  auVar17 = vpaddq_avx2(auVar17,auVar13);
  auVar4 = vpmovqd_avx512vl(auVar17);
  auVar4 = vpaddd_avx(auVar4,*(undefined1 (*) [16])flag_counts);
  *(undefined1 (*) [16])flag_counts = auVar4;
  auVar4 = vpunpcklqdq_avx(auVar21._0_16_,auVar20._0_16_);
  auVar22._0_16_ = ZEXT116(0) * auVar19._0_16_ + ZEXT116(1) * auVar4;
  auVar22._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar19._0_16_;
  auVar17 = vpblendd_avx2(auVar22,auVar24,0xc0);
  auVar4 = vpunpckhqdq_avx(auVar21._0_16_,auVar20._0_16_);
  auVar13 = vpblendd_avx2(ZEXT1632(auVar4),auVar26,0xf0);
  auVar26._0_16_ = ZEXT116(0) * auVar15 + ZEXT116(1) * auVar15;
  auVar26._16_16_ = ZEXT116(0) * auVar18._16_16_ + ZEXT116(1) * auVar15;
  auVar13 = vpblendd_avx2(auVar13,auVar26,0xc0);
  auVar17 = vpaddq_avx2(auVar17,auVar13);
  auVar26 = vpunpcklqdq_avx2(auVar9,auVar10);
  auVar13 = vpunpckhqdq_avx2(auVar9,auVar10);
  auVar10 = vperm2i128_avx2(auVar26,auVar11,0x31);
  auVar12 = vpermt2q_avx512vl(auVar13,auVar12,auVar11);
  auVar13 = vpermt2q_avx512vl(auVar10,auVar30,auVar16);
  auVar30 = vpblendd_avx2(auVar12,auVar16,0xc0);
  auVar17 = vpaddq_avx2(auVar17,auVar13);
  auVar17 = vpaddq_avx2(auVar17,auVar30);
  auVar17 = vpsrlq_avx2(auVar17,4);
  auVar4 = vpmovqd_avx512vl(auVar17);
  auVar4 = vpaddd_avx(auVar4,*(undefined1 (*) [16])(flag_counts + 4));
  *(undefined1 (*) [16])(flag_counts + 4) = auVar4;
  pospopcnt_u8_scalar_naive(data_00,len & 0xff,flag_counts);
  return;
}

Assistant:

void pospopcnt_u8_avx2_horizreduce(const uint8_t* data, size_t len, uint32_t* flag_counts) {
    const __m256i zero = _mm256_setzero_si256();

    __m256i counter_a = zero;
    __m256i counter_b = zero;
    __m256i counter_c = zero;
    __m256i counter_d = zero;
    __m256i counter_e = zero;
    __m256i counter_f = zero;
    __m256i counter_g = zero;
    __m256i counter_h = zero;

    for (const uint8_t* end = &data[(len & ~127)]; data != end; data += 128) {
        // r0 = [a0|b0|c0|d0|e0|f0|g0|h0]
        // r1 = [a1|b1|c1|d1|e1|f1|g1|h1]
        // r2 = [a2|b2|c2|d2|e2|f2|g2|h2]
        // r3 = [a3|b3|c3|d3|e3|f3|g3|h3]
        const __m256i r0 = _mm256_loadu_si256((__m256i*)&data[0*32]);
        const __m256i r1 = _mm256_loadu_si256((__m256i*)&data[1*32]);
        const __m256i r2 = _mm256_loadu_si256((__m256i*)&data[2*32]);
        const __m256i r3 = _mm256_loadu_si256((__m256i*)&data[3*32]);

        // s0 = [a0+a1|c0+c1|e0+e1|g0+g1]
        // s1 = [b0+b1|d0+d1|f0+f1|h0+h1]
        // s2 = [a2+a3|c2+c3|e2+e3|g2+g3]
        // s3 = [b2+b3|d2+d3|f2+f3|h2+h3]
        const __m256i s0 = avx2_add1_even(r0, r1);
        const __m256i s1 = avx2_add1_odd (r0, r1);
        const __m256i s2 = avx2_add1_even(r2, r3);
        const __m256i s3 = avx2_add1_odd (r2, r3);

        // d0 = [a0+a1+a2+a3|e0+e1+e2+e3]
        // d1 = [b0+b1+b2+b3|f0+f1+f2+f3]
        // d2 = [c0+c1+c2+c3|g0+g1+g2+g3]
        // d3 = [d0+d1+d2+d3|h0+h1+h2+h3]
        const __m256i d0 = avx2_add2_even(s0, s2);
        const __m256i d1 = avx2_add2_even(s1, s3);
        const __m256i d2 = avx2_add2_odd (s0, s2);
        const __m256i d3 = avx2_add2_odd (s1, s3);

        // popcnt for 4-bit subwords in each registers
        const __m256i mask_lo = _mm256_set1_epi8(0x0f);
        const __m256i mask_hi = _mm256_set1_epi8(0xf0);
        // Note: counter for higher nibble have to be divided by 16
        const __m256i sum0 = _mm256_sad_epu8(d0 & mask_lo, zero);
        const __m256i sum1 = _mm256_sad_epu8(d0 & mask_hi, zero);
        const __m256i sum2 = _mm256_sad_epu8(d1 & mask_lo, zero);
        const __m256i sum3 = _mm256_sad_epu8(d1 & mask_hi, zero);
        const __m256i sum4 = _mm256_sad_epu8(d2 & mask_lo, zero);
        const __m256i sum5 = _mm256_sad_epu8(d2 & mask_hi, zero);
        const __m256i sum6 = _mm256_sad_epu8(d3 & mask_lo, zero);
        const __m256i sum7 = _mm256_sad_epu8(d3 & mask_hi, zero);

        counter_a = _mm256_add_epi64(counter_a, sum0);
        counter_b = _mm256_add_epi64(counter_b, sum1);
        counter_c = _mm256_add_epi64(counter_c, sum2);
        counter_d = _mm256_add_epi64(counter_d, sum3);
        counter_e = _mm256_add_epi64(counter_e, sum4);
        counter_f = _mm256_add_epi64(counter_f, sum5);
        counter_g = _mm256_add_epi64(counter_g, sum6);
        counter_h = _mm256_add_epi64(counter_h, sum7);
    }

    flag_counts[0] += avx2_sum_epu64(counter_a);
    flag_counts[1] += avx2_sum_epu64(counter_c);
    flag_counts[2] += avx2_sum_epu64(counter_e);
    flag_counts[3] += avx2_sum_epu64(counter_g);
    flag_counts[4] += avx2_sum_epu64(counter_b) >> 4;
    flag_counts[5] += avx2_sum_epu64(counter_d) >> 4;
    flag_counts[6] += avx2_sum_epu64(counter_f) >> 4;
    flag_counts[7] += avx2_sum_epu64(counter_h) >> 4;

    // scalar tail loop
    pospopcnt_u8_scalar_naive(data, len % 256, flag_counts);
}